

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Environment *this;
  VkAllocationCallbacks **this_00;
  RefData<vk::Handle<(vk::HandleType)23>_> data;
  allocator<char> local_1f1;
  string local_1f0;
  Move<vk::Handle<(vk::HandleType)23>_> local_1c0;
  RefData<vk::Handle<(vk::HandleType)23>_> local_1a0;
  undefined1 local_180 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> obj;
  Resources res;
  Environment env;
  Context *context_local;
  TestStatus *local_10;
  
  this = (Environment *)
         &res.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
          m_allocator;
  local_10 = __return_storage_ptr__;
  Environment::Environment(this,context,1);
  this_00 = &obj.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  Framebuffer::Resources::Resources
            ((Resources *)this_00,this,(Parameters *)((long)&context_local + 7));
  Framebuffer::create(&local_1c0,this,(Resources *)this_00,(Parameters *)((long)&context_local + 7))
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1a0,(Move *)&local_1c0);
  data.deleter.m_deviceIface = local_1a0.deleter.m_deviceIface;
  data.object.m_internal = local_1a0.object.m_internal;
  data.deleter.m_device = local_1a0.deleter.m_device;
  data.deleter.m_allocator = local_1a0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_180,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_1c0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Ok",&local_1f1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  Framebuffer::Resources::~Resources
            ((Resources *)
             &obj.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}